

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O2

void __thiscall
ScriptCompression::Ser<DataStream>(ScriptCompression *this,DataStream *s,CScript *script)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  uint nSize;
  CompressedScript compr;
  uint local_5c;
  Span<unsigned_char> local_58;
  direct_or_indirect local_48;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = 0;
  local_48.direct[0x20] = '\0';
  local_24 = 0;
  bVar3 = CompressScript(script,(CompressedScript *)&local_48.indirect_contents);
  if (bVar3) {
    local_58.m_data = (uchar *)&local_48;
    if (0x21 < local_24) {
      local_58.m_data = (uchar *)local_48.indirect_contents.indirect;
    }
    uVar1 = local_24 - 0x22;
    if (0x21 >= local_24) {
      uVar1 = local_24;
    }
    local_58.m_size = (size_t)uVar1;
    DataStream::operator<<(s,&local_58);
  }
  else {
    uVar1 = (script->super_CScriptBase)._size;
    local_5c = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      local_5c = uVar1;
    }
    local_5c = local_5c + 6;
    local_58.m_data = (uchar *)&local_5c;
    Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<DataStream>
              ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)&local_58,s);
    uVar1 = (script->super_CScriptBase)._size;
    local_58.m_data = (uchar *)script;
    if (0x1c < uVar1) {
      local_58.m_data = (uchar *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    uVar2 = uVar1 - 0x1d;
    if (0x1c >= uVar1) {
      uVar2 = uVar1;
    }
    local_58.m_size = (size_t)uVar2;
    DataStream::operator<<(s,(Span<const_unsigned_char> *)&local_58);
  }
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const CScript& script) {
        CompressedScript compr;
        if (CompressScript(script, compr)) {
            s << Span{compr};
            return;
        }
        unsigned int nSize = script.size() + nSpecialScripts;
        s << VARINT(nSize);
        s << Span{script};
    }